

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::writeUint32Low24(deUint8 *dst,deUint32 val)

{
  deUint32 uint32ByteOffset0To24;
  deUint32 val_local;
  deUint8 *dst_local;
  
  writeUint24(dst,val);
  return;
}

Assistant:

inline void writeUint32Low24 (deUint8* dst, deUint32 val)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffset0To24	= 0;
#else
	const deUint32 uint32ByteOffset0To24	= 1;
#endif

	writeUint24(dst + uint32ByteOffset0To24, val);
}